

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV1SoftSkinBlock(Parser *this)

{
  pointer *pppVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  pointer pMVar5;
  size_t __n;
  pointer pBVar6;
  pointer pBVar7;
  size_t sVar8;
  iterator __position;
  _Alloc_hider __s2;
  size_type sVar9;
  long *__s2_00;
  int iVar10;
  byte *pbVar11;
  ulong uVar12;
  pointer pMVar13;
  long lVar14;
  uint uVar15;
  uint numVerts;
  uint numWeights;
  pair<int,_float> me;
  string bone;
  string name;
  uint local_d8;
  uint local_d4;
  pair<int,_float> local_d0;
  string local_c8;
  uint local_a4;
  long *local_a0;
  size_t local_98;
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *local_60;
  vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *local_58;
  vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *local_50;
  pointer local_48;
  Parser *local_40;
  pointer local_38;
  
  do {
    pcVar4 = this->filePtr;
    cVar2 = *pcVar4;
    if (cVar2 == '{') {
      this->filePtr = pcVar4 + 1;
    }
    else {
      if (cVar2 == '\0') {
        return;
      }
      if (cVar2 == '}') {
        this->filePtr = pcVar4 + 1;
        return;
      }
      local_d8 = 0;
      uVar12 = (long)this->filePtr - (long)pcVar4;
      pbVar11 = (byte *)this->filePtr;
      while( true ) {
        if (((ulong)*pbVar11 < 0x21) && ((0x100003601U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))
        break;
        this->filePtr = (char *)(pbVar11 + 1);
        uVar12 = uVar12 + 1;
        pbVar11 = pbVar11 + 1;
      }
      if ((uVar12 & 0xffffffff) != 0) {
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,pcVar4,pcVar4 + (uVar12 & 0xffffffff));
        sVar8 = local_98;
        __s2_00 = local_a0;
        pMVar13 = (this->m_vMeshes).
                  super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar5 = (this->m_vMeshes).
                 super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pMVar13 == pMVar5) {
          pMVar13 = (pointer)0x0;
        }
        else {
          do {
            __n = (pMVar13->super_BaseNode).mName._M_string_length;
            if ((__n == sVar8) &&
               ((__n == 0 ||
                (iVar10 = bcmp((pMVar13->super_BaseNode).mName._M_dataplus._M_p,__s2_00,__n),
                iVar10 == 0)))) goto LAB_003eb7b2;
            pMVar13 = pMVar13 + 1;
          } while (pMVar13 != pMVar5);
          pMVar13 = (pointer)0x0;
        }
LAB_003eb7b2:
        if (pMVar13 == (pointer)0x0) {
          LogWarning(this,"Encountered unknown mesh in *MESH_SOFTSKINVERTS section");
          pbVar11 = (byte *)this->filePtr;
          while( true ) {
            while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))
                  ) {
              pbVar11 = pbVar11 + 1;
            }
            this->filePtr = (char *)pbVar11;
            bVar3 = *pbVar11;
            if (bVar3 == 0x7d) {
              this->filePtr = (char *)(pbVar11 + 1);
              if (local_a0 == local_90) {
                return;
              }
              operator_delete(local_a0,local_90[0] + 1);
              return;
            }
            if (((9 < (byte)(bVar3 - 0x30)) && (bVar3 != 0x2d)) && (bVar3 != 0x2b)) break;
            while ((0xd < *pbVar11 || ((0x2401U >> (*pbVar11 & 0x1f) & 1) == 0))) {
              pbVar11 = pbVar11 + 1;
            }
            for (; (*pbVar11 == 0xd || (*pbVar11 == 10)); pbVar11 = pbVar11 + 1) {
            }
            this->filePtr = (char *)pbVar11;
          }
        }
        else {
          pbVar11 = (byte *)this->filePtr;
          while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0)))
          {
            pbVar11 = pbVar11 + 1;
          }
          this->filePtr = (char *)pbVar11;
          ParseLV4MeshLong(this,&local_d8);
          local_60 = &pMVar13->mBoneVertices;
          std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::reserve
                    (local_60,(ulong)local_d8);
          if (local_d8 != 0) {
            local_58 = &pMVar13->mBones;
            uVar15 = 0;
            local_48 = pMVar13;
            local_40 = this;
            do {
              pbVar11 = (byte *)this->filePtr;
              while (((ulong)*pbVar11 < 0x21 &&
                     ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
                pbVar11 = pbVar11 + 1;
              }
              this->filePtr = (char *)pbVar11;
              ParseLV4MeshLong(this,&local_d4);
              local_c8._M_dataplus._M_p = (pointer)0x0;
              local_c8._M_string_length = 0;
              local_c8.field_2._M_allocated_capacity = 0;
              std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
              emplace_back<Assimp::ASE::BoneVertex>(local_60,(BoneVertex *)&local_c8);
              local_a4 = uVar15;
              if (local_c8._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_c8._M_dataplus._M_p,
                                local_c8.field_2._M_allocated_capacity -
                                (long)local_c8._M_dataplus._M_p);
              }
              pBVar6 = (pMVar13->mBoneVertices).
                       super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_50 = (vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                         (pBVar6 + -1);
              std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::reserve
                        ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                         local_50,(ulong)local_d4);
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              local_c8._M_string_length = 0;
              local_c8.field_2._M_allocated_capacity =
                   local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              if (local_d4 != 0) {
                uVar15 = 0;
                local_38 = pBVar6;
                do {
                  local_c8._M_string_length = 0;
                  *local_c8._M_dataplus._M_p = '\0';
                  ParseString(this,&local_c8,"*MESH_SOFTSKINVERTS.Bone");
                  sVar9 = local_c8._M_string_length;
                  __s2._M_p = local_c8._M_dataplus._M_p;
                  local_d0.first = -1;
                  local_d0.second = 0.0;
                  pBVar7 = (pMVar13->mBones).
                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar14 = (long)(pMVar13->mBones).
                                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7;
                  if (lVar14 != 0) {
                    uVar12 = 0;
                    do {
                      sVar8 = pBVar7[uVar12].mName._M_string_length;
                      if ((sVar8 == sVar9) &&
                         ((sVar8 == 0 ||
                          (iVar10 = bcmp(pBVar7[uVar12].mName._M_dataplus._M_p,__s2._M_p,sVar8),
                          iVar10 == 0)))) {
                        local_d0.first = (int)uVar12;
                        break;
                      }
                      uVar12 = (ulong)((int)uVar12 + 1);
                    } while (uVar12 < (ulong)(lVar14 >> 5));
                  }
                  pBVar6 = local_38;
                  this = local_40;
                  pMVar13 = local_48;
                  if (local_d0.first == -1) {
                    local_d0.first =
                         (int)((ulong)((long)(local_48->mBones).
                                             super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_48->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
                    local_80[0] = local_70;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_80,local_c8._M_dataplus._M_p,
                               local_c8._M_dataplus._M_p + local_c8._M_string_length);
                    std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::
                    emplace_back<Assimp::ASE::Bone>(local_58,(Bone *)local_80);
                    if (local_80[0] != local_70) {
                      operator_delete(local_80[0],local_70[0] + 1);
                    }
                  }
                  ParseLV4MeshFloat(this,&local_d0.second);
                  __position._M_current =
                       pBVar6[-1].mBoneWeights.
                       super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      pBVar6[-1].mBoneWeights.
                      super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
                    _M_realloc_insert<std::pair<int,float>const&>(local_50,__position,&local_d0);
                  }
                  else {
                    *__position._M_current = local_d0;
                    pppVar1 = &pBVar6[-1].mBoneWeights.
                               super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *pppVar1 = *pppVar1 + 1;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 < local_d4);
              }
              uVar15 = local_a4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < local_d8);
          }
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
      }
    }
    pbVar11 = (byte *)(this->filePtr + 1);
    this->filePtr = (char *)pbVar11;
    while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
      pbVar11 = pbVar11 + 1;
    }
    this->filePtr = (char *)pbVar11;
  } while( true );
}

Assistant:

void Parser::ParseLV1SoftSkinBlock()
{
    // TODO: fix line counting here

    // **************************************************************
    // The soft skin block is formatted differently. There are no
    // nested sections supported and the single elements aren't
    // marked by keywords starting with an asterisk.

    /**
    FORMAT BEGIN

    *MESH_SOFTSKINVERTS {
    <nodename>
    <number of vertices>

    [for <number of vertices> times:]
        <number of weights> [for <number of weights> times:] <bone name> <weight>
    }

    FORMAT END
    */
    // **************************************************************
    while (true)
    {
        if (*filePtr == '}'      )  {++filePtr;return;}
        else if (*filePtr == '\0')  return;
        else if (*filePtr == '{' )  ++filePtr;

        else // if (!IsSpace(*filePtr) && !IsLineEnd(*filePtr))
        {
            ASE::Mesh* curMesh      = NULL;
            unsigned int numVerts   = 0;

            const char* sz = filePtr;
            while (!IsSpaceOrNewLine(*filePtr))++filePtr;

            const unsigned int diff = (unsigned int)(filePtr-sz);
            if (diff)
            {
                std::string name = std::string(sz,diff);
                for (std::vector<ASE::Mesh>::iterator it = m_vMeshes.begin();
                    it != m_vMeshes.end(); ++it)
                {
                    if ((*it).mName == name)
                    {
                        curMesh = & (*it);
                        break;
                    }
                }
                if (!curMesh)
                {
                    LogWarning("Encountered unknown mesh in *MESH_SOFTSKINVERTS section");

                    // Skip the mesh data - until we find a new mesh
                    // or the end of the *MESH_SOFTSKINVERTS section
                    while (true)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        if (*filePtr == '}')
                            {++filePtr;return;}
                        else if (!IsNumeric(*filePtr))
                            break;

                        SkipLine(&filePtr);
                    }
                }
                else
                {
                    SkipSpacesAndLineEnd(&filePtr);
                    ParseLV4MeshLong(numVerts);

                    // Reserve enough storage
                    curMesh->mBoneVertices.reserve(numVerts);

                    for (unsigned int i = 0; i < numVerts;++i)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        unsigned int numWeights;
                        ParseLV4MeshLong(numWeights);

                        curMesh->mBoneVertices.push_back(ASE::BoneVertex());
                        ASE::BoneVertex& vert = curMesh->mBoneVertices.back();

                        // Reserve enough storage
                        vert.mBoneWeights.reserve(numWeights);

                        std::string bone;
                        for (unsigned int w = 0; w < numWeights;++w) {
                            bone.clear();
                            ParseString(bone,"*MESH_SOFTSKINVERTS.Bone");

                            // Find the bone in the mesh's list
                            std::pair<int,ai_real> me;
                            me.first = -1;

                            for (unsigned int n = 0; n < curMesh->mBones.size();++n) {
                                if (curMesh->mBones[n].mName == bone) {
                                    me.first = n;
                                    break;
                                }
                            }
                            if (-1 == me.first) {
                                // We don't have this bone yet, so add it to the list
                                me.first = static_cast<int>( curMesh->mBones.size() );
                                curMesh->mBones.push_back( ASE::Bone( bone ) );
                            }
                            ParseLV4MeshFloat( me.second );

                            // Add the new bone weight to list
                            vert.mBoneWeights.push_back(me);
                        }
                    }
                }
            }
        }
        ++filePtr;
        SkipSpacesAndLineEnd(&filePtr);
    }
}